

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckFeatures.cpp
# Opt level: O0

bool __thiscall
GdlRenderer::PreCompileFeatures
          (GdlRenderer *this,GrcManager *pcman,GrcFont *param_3,uint32_t *pfxdFeatVersion)

{
  ulong uVar1;
  bool bVar2;
  size_type_conflict sVar3;
  reference ppGVar4;
  string *psVar5;
  reference pvVar6;
  undefined4 *in_RCX;
  GrcManager *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> stnID;
  uint nID;
  size_t iID;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vnIDs;
  GdlFeatureDefn *pfeat;
  size_t ipfeat;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> setID;
  int nInternalID;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffffd68;
  GdlFeatureDefn *in_stack_fffffffffffffd70;
  allocator *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  value_type in_stack_fffffffffffffd80;
  GrcSymbolTable *in_stack_fffffffffffffd88;
  undefined6 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd96;
  undefined1 in_stack_fffffffffffffd97;
  _Rb_tree_const_iterator<unsigned_int> in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda0;
  allocator *in_stack_fffffffffffffda8;
  value_type in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  int __val;
  GrcErrorList *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdd0;
  GdlFeatureDefn *in_stack_fffffffffffffdf0;
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  _Base_ptr local_180;
  undefined1 local_178;
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  byte local_128;
  byte local_127;
  byte local_126;
  allocator<char> local_125;
  undefined1 local_124 [4];
  undefined1 *local_120;
  undefined8 local_118;
  string local_110 [8];
  GrcSymbolTable *in_stack_fffffffffffffef8;
  GdlFeatureDefn *in_stack_ffffffffffffff00;
  GdlFeatureDefn *in_stack_ffffffffffffff08;
  string local_f0 [32];
  string local_d0 [32];
  _Self local_b0;
  _Self local_a8;
  value_type local_9c;
  string *local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  value_type local_68;
  ulong local_60;
  int local_24;
  undefined4 *local_20;
  GrcManager *local_10;
  
  *in_RCX = 0x10000;
  local_24 = 0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x157ead);
  local_60 = 0;
  while( true ) {
    uVar1 = local_60;
    sVar3 = std::vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>::size
                      ((vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_> *)
                       (in_RDI + 0x58));
    __val = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    if (sVar3 <= uVar1) break;
    ppGVar4 = std::vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>::operator[]
                        ((vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_> *)
                         (in_RDI + 0x58),local_60);
    local_68 = *ppGVar4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x157f1e);
    GdlFeatureDefn::AltIDs
              (in_stack_fffffffffffffd70,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd68);
    local_98 = (string *)0x0;
    while (in_stack_fffffffffffffdd0 = local_98,
          psVar5 = (string *)
                   std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_80),
          in_stack_fffffffffffffdd0 < psVar5) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_80,(size_type_conflict)local_98);
      local_9c = *pvVar6;
      local_a8._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffd78,(key_type_conflict *)in_stack_fffffffffffffd70);
      local_b0._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     (in_stack_fffffffffffffd68);
      bVar2 = std::operator!=(&local_a8,&local_b0);
      if (bVar2) {
        local_126 = 0;
        local_127 = 0;
        local_128 = 0;
        if (local_9c < 0x1000000) {
          std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffd98._M_node >> 0x20));
        }
        else {
          local_124[0] = local_9c._3_1_;
          local_124[1] = local_9c._2_1_;
          local_124[2] = local_9c._1_1_;
          local_124[3] = (undefined1)local_9c;
          local_120 = local_124;
          local_118 = 4;
          in_stack_fffffffffffffdc0 = (GrcErrorList *)&local_125;
          std::allocator<char>::allocator();
          local_126 = 1;
          std::__cxx11::string::string(local_110,local_120,local_118,in_stack_fffffffffffffdc0);
          local_127 = 1;
          std::operator+((char)((ulong)in_stack_fffffffffffffd78 >> 0x38),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd70);
          local_128 = 1;
          std::operator+(in_stack_fffffffffffffd78,(char)((ulong)in_stack_fffffffffffffd70 >> 0x38))
          ;
        }
        if ((local_128 & 1) != 0) {
          std::__cxx11::string::~string(local_f0);
        }
        if ((local_127 & 1) != 0) {
          std::__cxx11::string::~string(local_110);
        }
        if ((local_126 & 1) != 0) {
          std::allocator<char>::~allocator(&local_125);
        }
        in_stack_fffffffffffffda0 = (string *)0x0;
        if (local_68 != (value_type)0x0) {
          in_stack_fffffffffffffda0 = (string *)&(local_68->super_GdlDefn).super_GdlObject;
        }
        in_stack_fffffffffffffda8 = &local_149;
        in_stack_fffffffffffffdb0 = local_68;
        in_stack_fffffffffffffdb8 = in_stack_fffffffffffffda0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_148,"Duplicate feature ID: ",in_stack_fffffffffffffda8);
        std::__cxx11::string::string(local_170,local_d0);
        GrcErrorList::AddError
                  (in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                   (GdlObject *)in_stack_fffffffffffffdb0,(string *)in_stack_fffffffffffffda8,
                   in_stack_fffffffffffffda0);
        std::__cxx11::string::~string(local_170);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
        std::__cxx11::string::~string(local_d0);
      }
      else {
        pVar7 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       CONCAT17(in_stack_fffffffffffffd97,
                                CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)),
                       (value_type_conflict *)in_stack_fffffffffffffd88);
        in_stack_fffffffffffffd98 = pVar7.first._M_node;
        in_stack_fffffffffffffd97 = pVar7.second;
        local_180 = in_stack_fffffffffffffd98._M_node;
        local_178 = in_stack_fffffffffffffd97;
      }
      if (0xffff < local_9c) {
        *local_20 = 0x20000;
      }
      local_98 = local_98 + 1;
    }
    in_stack_fffffffffffffd96 = GdlFeatureDefn::ErrorCheck(in_stack_ffffffffffffff08);
    if ((bool)in_stack_fffffffffffffd96) {
      GdlFeatureDefn::SortFeatIDs(in_stack_fffffffffffffd80);
      GdlFeatureDefn::SortFeatSettings(in_stack_fffffffffffffdb0);
      GdlFeatureDefn::SetStdStyleFlag(local_68);
      in_stack_fffffffffffffd80 = local_68;
      in_stack_fffffffffffffd88 = GrcManager::SymbolTable(local_10);
      GdlFeatureDefn::FillInBoolean(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      GdlFeatureDefn::ErrorCheckContd(in_stack_fffffffffffffdf0);
      GdlFeatureDefn::CalculateDefault(in_stack_fffffffffffffdb0);
      GdlFeatureDefn::AssignInternalID(local_68,local_24);
      GdlFeatureDefn::RecordDebugInfo(local_68);
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_80);
      local_24 = (int)sVar3 + local_24;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd80);
    local_60 = local_60 + 1;
  }
  sVar3 = std::vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>::size
                    ((vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_> *)(in_RDI + 0x58))
  ;
  if (0x40 < sVar3) {
    paVar8 = &local_1a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"Number of features (",paVar8);
    std::vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>::size
              ((vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_> *)(in_RDI + 0x58));
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffda8);
    paVar8 = &local_1e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,") exceeds maximum of ",paVar8);
    std::__cxx11::to_string(__val);
    GrcErrorList::AddError
              (in_stack_fffffffffffffdc0,__val,(GdlObject *)in_stack_fffffffffffffdb0,
               (string *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
               (string *)in_stack_fffffffffffffd98._M_node,in_stack_fffffffffffffdd0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x1586d4);
  return true;
}

Assistant:

bool GdlRenderer::PreCompileFeatures(GrcManager * pcman, GrcFont * /*pfont*/, uint32_t * pfxdFeatVersion)
{
	*pfxdFeatVersion = 0x00010000;

	int nInternalID = 0;

	std::set<unsigned int> setID;

	for (size_t ipfeat = 0; ipfeat < m_vpfeat.size(); ipfeat++)
	{
		GdlFeatureDefn * pfeat = m_vpfeat[ipfeat];
		std::vector<unsigned int> vnIDs;
		pfeat->AltIDs(vnIDs);
		for (size_t iID = 0; iID < vnIDs.size(); iID++)
		{
			unsigned int nID = vnIDs[iID];
			if (setID.find(nID) != setID.end()) // is a member
			{
				auto stnID = nID > 0x00FFFFFF 
					? '\'' +std::string{char(nID >> 24), char(nID >> 16), char(nID >> 8), char(nID)} + '\''
					: std::to_string(nID);
				g_errorList.AddError(3152, pfeat, "Duplicate feature ID: ", stnID);
			}
			else
				setID.insert(nID);

			if (nID > 0x0000FFFF)
				*pfxdFeatVersion = 0x00020000;
		}

		if (pfeat->ErrorCheck())
		{
			pfeat->SortFeatIDs();
			pfeat->SortFeatSettings();
			pfeat->SetStdStyleFlag();
			pfeat->FillInBoolean(pcman->SymbolTable());
			pfeat->ErrorCheckContd();
			pfeat->CalculateDefault();
			pfeat->AssignInternalID(nInternalID); 
			pfeat->RecordDebugInfo();

			nInternalID += int(vnIDs.size());  // each alternate ID has its own internal ID
		}
	}

	if (m_vpfeat.size() > kMaxFeatures)
	{
		g_errorList.AddError(3153, NULL,
			"Number of features (",
			std::to_string(m_vpfeat.size()),
			") exceeds maximum of ",
			std::to_string(kMaxFeatures));
	}

	return true;
}